

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::anon_unknown_2::GenerateMessageToPool
               (string *name_prefix,Descriptor *message,Printer *printer)

{
  _anonymous_namespace_ *this;
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  undefined8 *puVar4;
  long *plVar5;
  Descriptor *pDVar6;
  FieldDescriptor *pFVar7;
  FieldDescriptor *this_00;
  char *pcVar8;
  size_type *psVar9;
  FieldDescriptor *pFVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type sVar12;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  long lVar15;
  long lVar16;
  long lVar17;
  string out;
  string local_148;
  string out_2;
  allocator local_f2;
  allocator local_f1;
  string out_1;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  Descriptor *local_88;
  string class_name;
  string local_50;
  
  if (*(char *)(*(long *)(message + 0x20) + 0x4b) != '\0') {
    return;
  }
  if (name_prefix->_M_string_length == 0) {
    out._M_dataplus._M_p = (pointer)&out.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"");
  }
  else {
    out._M_dataplus._M_p = (pointer)&out.field_2;
    pcVar1 = (name_prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out,pcVar1,pcVar1 + name_prefix->_M_string_length);
    std::__cxx11::string::append((char *)&out);
  }
  ReservedNamePrefix(&out_2,*(string **)(message + 8),*(FileDescriptor **)(message + 0x10));
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != &out.field_2) {
    uVar13 = out.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < out_2._M_string_length + out._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out_2._M_dataplus._M_p != &out_2.field_2) {
      uVar13 = out_2.field_2._M_allocated_capacity;
    }
    if (out_2._M_string_length + out._M_string_length <= (ulong)uVar13) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&out_2,0,(char *)0x0,(ulong)out._M_dataplus._M_p);
      goto LAB_0027ccb1;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&out,(ulong)out_2._M_dataplus._M_p)
  ;
LAB_0027ccb1:
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  psVar9 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_148.field_2._M_allocated_capacity = *psVar9;
    local_148.field_2._8_8_ = puVar4[3];
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar9;
    local_148._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_148._M_string_length = puVar4[1];
  *puVar4 = psVar9;
  puVar4[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_148,**(ulong **)(message + 8));
  class_name._M_dataplus._M_p = (pointer)&class_name.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    class_name.field_2._M_allocated_capacity = *psVar9;
    class_name.field_2._8_8_ = plVar5[3];
  }
  else {
    class_name.field_2._M_allocated_capacity = *psVar9;
    class_name._M_dataplus._M_p = (pointer)*plVar5;
  }
  class_name._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out_2._M_dataplus._M_p != &out_2.field_2) {
    operator_delete(out_2._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != &out.field_2) {
    operator_delete(out._M_dataplus._M_p);
  }
  DescriptorFullName<google::protobuf::Descriptor>(&local_148,message,true);
  io::Printer::Print<char[8],std::__cxx11::string,char[11],std::__cxx11::string>
            (printer,
             "$pool->addMessage(\'^message^\', \\Google\\Protobuf\\Internal\\^class_name^::class)\n"
             ,(char (*) [8])0x420c9a,&local_148,(char (*) [11])0x3e831b,&class_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  local_88 = message;
  if (0 < *(int *)(message + 4)) {
    lVar15 = 0;
    do {
      pFVar10 = (FieldDescriptor *)(*(long *)(local_88 + 0x28) + lVar15 * 0x48);
      if (*(once_flag **)(pFVar10 + 0x18) != (once_flag *)0x0) {
        local_148._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        out._M_dataplus._M_p = (pointer)pFVar10;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar10 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_148,
                   (FieldDescriptor **)&out);
      }
      if ((pFVar10[2] == (FieldDescriptor)0xb) &&
         (bVar3 = FieldDescriptor::is_map_message_type(pFVar10), bVar3)) {
        pDVar6 = FieldDescriptor::message_type(pFVar10);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"key","");
        pFVar7 = Descriptor::FindFieldByName(pDVar6,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        pDVar6 = FieldDescriptor::message_type(pFVar10);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"value","");
        this_00 = Descriptor::FindFieldByName(pDVar6,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (pFVar10 + 8);
        if (*(once_flag **)(pFVar7 + 0x18) != (once_flag *)0x0) {
          local_148._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          out_1._M_dataplus._M_p = (pointer)pFVar7;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar7 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_148,
                     (FieldDescriptor **)&out_1);
        }
        std::__cxx11::string::string
                  ((string *)&out_2,
                   *(char **)(FieldDescriptor::kTypeToName + (ulong)(byte)pFVar7[2] * 8),&local_f1);
        out._M_dataplus._M_p = (pointer)&out.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&out,out_2._M_dataplus._M_p,
                   out_2._M_dataplus._M_p + out_2._M_string_length);
        if (out._M_string_length != 0) {
          sVar12 = 0;
          do {
            if ((byte)(out._M_dataplus._M_p[sVar12] + 0x9fU) < 0x1a) {
              out._M_dataplus._M_p[sVar12] = out._M_dataplus._M_p[sVar12] + -0x20;
            }
            sVar12 = sVar12 + 1;
          } while (out._M_string_length != sVar12);
        }
        if (*(once_flag **)(this_00 + 0x18) != (once_flag *)0x0) {
          local_148._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_a8._0_8_ = this_00;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(this_00 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_148,
                     (FieldDescriptor **)local_a8);
        }
        std::__cxx11::string::string
                  ((string *)local_c8,
                   *(char **)(FieldDescriptor::kTypeToName + (ulong)(byte)this_00[2] * 8),&local_f2)
        ;
        out_1._M_dataplus._M_p = (pointer)&out_1.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&out_1,local_c8._0_8_,
                   (FieldDescriptor *)(local_c8._0_8_ + local_c8._8_8_));
        if (out_1._M_string_length != 0) {
          sVar12 = 0;
          do {
            if ((byte)(out_1._M_dataplus._M_p[sVar12] + 0x9fU) < 0x1a) {
              out_1._M_dataplus._M_p[sVar12] = out_1._M_dataplus._M_p[sVar12] + -0x20;
            }
            sVar12 = sVar12 + 1;
          } while (out_1._M_string_length != sVar12);
        }
        paVar11 = &local_148.field_2;
        local_148._M_dataplus._M_p = (pointer)paVar11;
        pcVar8 = FastInt32ToBufferLeft(*(int32 *)(pFVar10 + 4),paVar11->_M_local_buf);
        local_148._M_string_length = (long)pcVar8 - (long)paVar11;
        pFVar10 = (FieldDescriptor *)(local_a8 + 0x10);
        local_a8._0_8_ = pFVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,local_148._M_dataplus._M_p,
                   local_148._M_dataplus._M_p + local_148._M_string_length);
        (anonymous_namespace)::EnumOrMessageSuffix_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)this_00,field,SUB81(pFVar10,0));
        io::Printer::
        Print<char[6],std::__cxx11::string,char[4],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[6],std::__cxx11::string>
                  (printer,
                   "->map(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^key^, \\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n"
                   ,(char (*) [6])0x43e04c,pbVar2,(char (*) [4])0x3f620b,&out,(char (*) [6])0x43fa60
                   ,&out_1,(char (*) [7])0x40a31d,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   (char (*) [6])"other",&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((FieldDescriptor *)local_a8._0_8_ != (FieldDescriptor *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out_1._M_dataplus._M_p != &out_1.field_2) {
          operator_delete(out_1._M_dataplus._M_p);
        }
        if ((FieldDescriptor *)local_c8._0_8_ != (FieldDescriptor *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != &out.field_2) {
          operator_delete(out._M_dataplus._M_p);
        }
        _Var14._M_p = out_2._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out_2._M_dataplus._M_p != &out_2.field_2) {
LAB_0027d3de:
          operator_delete(_Var14._M_p);
        }
      }
      else {
        lVar17 = *(long *)(pFVar10 + 0x28);
        if ((lVar17 == 0 || ((byte)pFVar10[1] & 0x10) == 0) ||
           ((*(int *)(lVar17 + 4) == 1 &&
            (((*(byte *)(*(long *)(lVar17 + 0x20) + 1) & 2) != 0 || (lVar17 == 0)))))) {
          pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (pFVar10 + 8);
          switch((byte)pFVar10[1] >> 5 & 3) {
          case 0:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                          ,0x1bc,
                          "std::string google::protobuf::compiler::php::(anonymous namespace)::LabelForField(const FieldDescriptor *)"
                         );
          case 1:
            out.field_2._M_allocated_capacity = 0x6c616e6f6974706f;
            break;
          case 2:
            out.field_2._M_allocated_capacity = 0x6465726975716572;
            break;
          case 3:
            out.field_2._M_allocated_capacity = 0x6465746165706572;
          }
          out._M_dataplus._M_p = (pointer)&out.field_2;
          out._M_string_length = 8;
          out.field_2._M_local_buf[8] = '\0';
          if (*(once_flag **)(pFVar10 + 0x18) != (once_flag *)0x0) {
            local_148._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
            local_c8._0_8_ = pFVar10;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(pFVar10 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_148
                       ,(FieldDescriptor **)local_c8);
          }
          std::__cxx11::string::string
                    ((string *)&out_1,
                     *(char **)(FieldDescriptor::kTypeToName + (ulong)(byte)pFVar10[2] * 8),
                     (allocator *)&local_50);
          out_2._M_dataplus._M_p = (pointer)&out_2.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&out_2,out_1._M_dataplus._M_p,
                     out_1._M_dataplus._M_p + out_1._M_string_length);
          if (out_2._M_string_length != 0) {
            sVar12 = 0;
            do {
              if ((byte)(out_2._M_dataplus._M_p[sVar12] + 0x9fU) < 0x1a) {
                out_2._M_dataplus._M_p[sVar12] = out_2._M_dataplus._M_p[sVar12] + -0x20;
              }
              sVar12 = sVar12 + 1;
            } while (out_2._M_string_length != sVar12);
          }
          paVar11 = &local_148.field_2;
          local_148._M_dataplus._M_p = (pointer)paVar11;
          pcVar8 = FastInt32ToBufferLeft(*(int32 *)(pFVar10 + 4),paVar11->_M_local_buf);
          local_148._M_string_length = (long)pcVar8 - (long)paVar11;
          pFVar7 = (FieldDescriptor *)(local_c8 + 0x10);
          local_c8._0_8_ = pFVar7;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,local_148._M_dataplus._M_p,
                     local_148._M_dataplus._M_p + local_148._M_string_length);
          (anonymous_namespace)::EnumOrMessageSuffix_abi_cxx11_
                    ((string *)local_a8,(_anonymous_namespace_ *)pFVar10,field_00,SUB81(pFVar7,0));
          io::Printer::
          Print<char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[7],std::__cxx11::string,char[6],std::__cxx11::string>
                    (printer,
                     "->^label^(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n"
                     ,(char (*) [6])0x43e04c,pbVar2,(char (*) [6])"label",&out,
                     (char (*) [5])0x4448a3,&out_2,(char (*) [7])0x40a31d,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     (char (*) [6])"other",(string *)local_a8);
          if ((FieldDescriptor *)local_a8._0_8_ != (FieldDescriptor *)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_);
          }
          if ((FieldDescriptor *)local_c8._0_8_ != (FieldDescriptor *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_2._M_dataplus._M_p != &out_2.field_2) {
            operator_delete(out_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_1._M_dataplus._M_p != &out_1.field_2) {
            operator_delete(out_1._M_dataplus._M_p);
          }
          _Var14._M_p = out._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != &out.field_2) goto LAB_0027d3de;
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < *(int *)(local_88 + 4));
  }
  if (0 < *(int *)(local_88 + 0x6c)) {
    lVar15 = 0;
    do {
      lVar17 = *(long *)(local_88 + 0x30);
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,"->oneof(^name^)\n",(char (*) [5])0x3f58c9,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar17 + 8 + lVar15 * 0x28));
      io::Printer::Indent(printer);
      io::Printer::Indent(printer);
      lVar17 = lVar17 + lVar15 * 0x28;
      if (0 < *(int *)(lVar17 + 4)) {
        lVar16 = 0;
        do {
          this = (_anonymous_namespace_ *)(*(long *)(lVar17 + 0x20) + lVar16 * 0x48);
          pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8)
          ;
          if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
            local_148._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
            out_1._M_dataplus._M_p = (pointer)this;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_148,
                       (FieldDescriptor **)&out_1);
          }
          std::__cxx11::string::string
                    ((string *)&out_2,
                     *(char **)(FieldDescriptor::kTypeToName + (ulong)(byte)this[2] * 8),
                     (allocator *)local_a8);
          out._M_dataplus._M_p = (pointer)&out.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&out,out_2._M_dataplus._M_p,
                     out_2._M_dataplus._M_p + out_2._M_string_length);
          if (out._M_string_length != 0) {
            sVar12 = 0;
            do {
              if ((byte)(out._M_dataplus._M_p[sVar12] + 0x9fU) < 0x1a) {
                out._M_dataplus._M_p[sVar12] = out._M_dataplus._M_p[sVar12] + -0x20;
              }
              sVar12 = sVar12 + 1;
            } while (out._M_string_length != sVar12);
          }
          paVar11 = &local_148.field_2;
          local_148._M_dataplus._M_p = (pointer)paVar11;
          pcVar8 = FastInt32ToBufferLeft(*(int32 *)(this + 4),paVar11->_M_local_buf);
          local_148._M_string_length = (long)pcVar8 - (long)paVar11;
          paVar11 = &out_1.field_2;
          out_1._M_dataplus._M_p = (pointer)paVar11;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out_1,local_148._M_dataplus._M_p,
                     local_148._M_dataplus._M_p + local_148._M_string_length);
          (anonymous_namespace)::EnumOrMessageSuffix_abi_cxx11_
                    ((string *)local_c8,this,field_01,SUB81(paVar11,0));
          io::Printer::
          Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[7],std::__cxx11::string,char[6],std::__cxx11::string>
                    (printer,
                     "->value(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n"
                     ,(char (*) [6])0x43e04c,pbVar2,(char (*) [5])0x4448a3,&out,
                     (char (*) [7])0x40a31d,&out_1,(char (*) [6])"other",(string *)local_c8);
          if ((FieldDescriptor *)local_c8._0_8_ != (FieldDescriptor *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_1._M_dataplus._M_p != &out_1.field_2) {
            operator_delete(out_1._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != &out.field_2) {
            operator_delete(out._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_2._M_dataplus._M_p != &out_2.field_2) {
            operator_delete(out_2._M_dataplus._M_p);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)(lVar17 + 4));
      }
      io::Printer::Print<>(printer,"->finish()\n");
      io::Printer::Outdent(printer);
      io::Printer::Outdent(printer);
      lVar15 = lVar15 + 1;
    } while (lVar15 < *(int *)(local_88 + 0x6c));
  }
  pDVar6 = local_88;
  io::Printer::Print<>(printer,"->finalizeToPool();\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"\n");
  if (0 < *(int *)(pDVar6 + 0x70)) {
    lVar15 = 0;
    lVar17 = 0;
    do {
      GenerateMessageToPool(&class_name,(Descriptor *)(*(long *)(pDVar6 + 0x38) + lVar15),printer);
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0x88;
    } while (lVar17 < *(int *)(pDVar6 + 0x70));
  }
  if (0 < *(int *)(pDVar6 + 0x74)) {
    lVar15 = 0;
    lVar17 = 0;
    do {
      GenerateEnumToPool((EnumDescriptor *)(*(long *)(pDVar6 + 0x40) + lVar15),printer);
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0x48;
    } while (lVar17 < *(int *)(pDVar6 + 0x74));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)class_name._M_dataplus._M_p != &class_name.field_2) {
    operator_delete(class_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GenerateCInit(const Descriptor* message, io::Printer* printer) {
  std::string c_name = message->full_name();
  c_name = StringReplace(c_name, ".", "_", true);

  printer->Print(
      "  $c_name$_ModuleInit();\n",
      "c_name", c_name);

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateCInit(message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumCInit(message->enum_type(i), printer);
  }
}